

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_bbdpre.c
# Opt level: O1

int CVBBDPrecSetup(sunrealtype t,N_Vector y,N_Vector fy,int jok,int *jcurPtr,sunrealtype gamma,
                  void *bbd_data)

{
  long lVar1;
  CVodeMem cv_mem;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  sunrealtype *psVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  char *msgfmt;
  long lVar22;
  long j;
  bool bVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  long local_98;
  double local_90;
  long local_88;
  
  cv_mem = *(CVodeMem *)((long)bbd_data + 0x98);
  if (jok == 0) {
    *jcurPtr = 1;
    iVar9 = SUNMatZero(*(undefined8 *)((long)bbd_data + 0x38));
    if (iVar9 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar9 = 0x1f7;
      goto LAB_00111841;
    }
    if (iVar9 != 0) {
      return 1;
    }
    uVar2 = *(undefined8 *)((long)bbd_data + 0x50);
    uVar3 = *(undefined8 *)((long)bbd_data + 0x58);
    uVar4 = *(undefined8 *)((long)bbd_data + 0x60);
    lVar5 = *(long *)((long)bbd_data + 0x98);
    local_90 = 1.0;
    N_VScale(y,uVar3);
    if ((*(code **)((long)bbd_data + 0x30) == (code *)0x0) ||
       (iVar9 = (**(code **)((long)bbd_data + 0x30))
                          (t,*(undefined8 *)((long)bbd_data + 0x78),y,*(undefined8 *)(lVar5 + 0x18))
       , iVar9 == 0)) {
      iVar9 = (**(code **)((long)bbd_data + 0x28))
                        (t,*(undefined8 *)((long)bbd_data + 0x78),uVar3,uVar2,
                         *(undefined8 *)(lVar5 + 0x18));
      *(long *)((long)bbd_data + 0x90) = *(long *)((long)bbd_data + 0x90) + 1;
      if (iVar9 == 0) {
        lVar10 = N_VGetArrayPointer(y);
        lVar11 = N_VGetArrayPointer(uVar2);
        lVar12 = N_VGetArrayPointer(*(undefined8 *)(lVar5 + 200));
        lVar13 = N_VGetArrayPointer(uVar3);
        lVar14 = N_VGetArrayPointer(uVar4);
        if (*(int *)(lVar5 + 0x58) == 0) {
          local_98 = 0;
        }
        else {
          local_98 = N_VGetArrayPointer(*(undefined8 *)(lVar5 + 0x108));
        }
        dVar24 = (double)N_VWrmsNorm(uVar2,*(undefined8 *)(lVar5 + 200));
        if ((dVar24 != 0.0) || (NAN(dVar24))) {
          local_90 = dVar24 * (double)*(long *)((long)bbd_data + 0x78) *
                              ABS(*(double *)(lVar5 + 0x140)) * 1000.0 * *(double *)(lVar5 + 8);
        }
        lVar6 = *bbd_data;
        lVar7 = *(long *)((long)bbd_data + 8);
        lVar17 = lVar7 + lVar6 + 1;
        lVar20 = *(long *)((long)bbd_data + 0x78);
        if (lVar17 < *(long *)((long)bbd_data + 0x78)) {
          lVar20 = lVar17;
        }
        if (0 < lVar20) {
          local_88 = 0;
          lVar15 = 1;
          do {
            j = lVar15 + -1;
            lVar22 = *(long *)((long)bbd_data + 0x78);
            if (lVar15 <= lVar22) {
              iVar9 = *(int *)(lVar5 + 0x58);
              lVar18 = j;
              do {
                dVar24 = *(double *)(lVar10 + lVar18 * 8);
                dVar25 = ABS(dVar24) * *(double *)((long)bbd_data + 0x20);
                dVar26 = local_90 / *(double *)(lVar12 + lVar18 * 8);
                if (dVar25 <= dVar26) {
                  dVar25 = dVar26;
                }
                if (iVar9 != 0) {
                  dVar26 = *(double *)(local_98 + lVar18 * 8);
                  dVar27 = ABS(dVar26);
                  if ((dVar27 != 1.0) || (NAN(dVar27))) {
                    if ((dVar27 == 2.0) && ((!NAN(dVar27) && ((dVar24 + dVar25) * dVar26 <= 0.0))))
                    goto LAB_001119c5;
                  }
                  else if ((dVar24 + dVar25) * dVar26 < 0.0) {
LAB_001119c5:
                    dVar25 = -dVar25;
                  }
                }
                *(double *)(lVar13 + lVar18 * 8) = dVar25 + *(double *)(lVar13 + lVar18 * 8);
                lVar18 = lVar18 + lVar17;
              } while (lVar18 < lVar22);
            }
            iVar9 = (**(code **)((long)bbd_data + 0x28))
                              (t,lVar22,uVar3,uVar4,*(undefined8 *)(lVar5 + 0x18));
            *(long *)((long)bbd_data + 0x90) = *(long *)((long)bbd_data + 0x90) + 1;
            if (iVar9 != 0) goto LAB_00111bb9;
            lVar22 = local_88;
            if (lVar15 <= *(long *)((long)bbd_data + 0x78)) {
              do {
                dVar24 = *(double *)(lVar10 + j * 8);
                *(double *)(lVar13 + j * 8) = dVar24;
                psVar16 = SUNBandMatrix_Column(*(SUNMatrix *)((long)bbd_data + 0x38),j);
                dVar25 = ABS(*(double *)(lVar10 + j * 8)) * *(double *)((long)bbd_data + 0x20);
                dVar26 = local_90 / *(double *)(lVar12 + j * 8);
                if (dVar25 <= dVar26) {
                  dVar25 = dVar26;
                }
                if (*(int *)(lVar5 + 0x58) != 0) {
                  dVar26 = *(double *)(local_98 + j * 8);
                  dVar27 = ABS(dVar26);
                  if ((dVar27 != 1.0) || (NAN(dVar27))) {
                    if ((dVar27 == 2.0) && ((!NAN(dVar27) && ((dVar24 + dVar25) * dVar26 <= 0.0))))
                    goto LAB_00111afd;
                  }
                  else if ((dVar24 + dVar25) * dVar26 < 0.0) {
LAB_00111afd:
                    dVar25 = -dVar25;
                  }
                }
                lVar19 = j - *(long *)((long)bbd_data + 0x10);
                lVar18 = 0;
                if (0 < lVar19) {
                  lVar18 = lVar19;
                }
                lVar8 = *(long *)((long)bbd_data + 0x78);
                lVar21 = *(long *)((long)bbd_data + 0x18) + j;
                lVar1 = lVar8 + -1;
                if (lVar1 <= lVar21) {
                  lVar21 = lVar1;
                }
                if (lVar18 <= lVar21) {
                  if (lVar19 < 1) {
                    lVar19 = 0;
                  }
                  lVar19 = lVar19 + -1;
                  do {
                    *(double *)((long)psVar16 + lVar19 * 8 + lVar22 + 8) =
                         (*(double *)(lVar14 + 8 + lVar19 * 8) -
                         *(double *)(lVar11 + 8 + lVar19 * 8)) * (1.0 / dVar25);
                    lVar19 = lVar19 + 1;
                  } while (lVar19 < lVar21);
                }
                j = j + lVar17;
                lVar22 = lVar22 + ~(lVar7 + lVar6) * 8;
              } while (j < lVar8);
            }
            local_88 = local_88 + -8;
            bVar23 = lVar15 != lVar20;
            lVar15 = lVar15 + 1;
          } while (bVar23);
        }
        iVar9 = 0;
      }
    }
LAB_00111bb9:
    if (iVar9 < 0) {
      msgfmt = "The gloc or cfn routine failed in an unrecoverable manner.";
      iVar9 = 0x200;
      goto LAB_00111841;
    }
    if (iVar9 != 0) {
      return 1;
    }
    iVar9 = SUNMatCopy(*(undefined8 *)((long)bbd_data + 0x38),*(undefined8 *)((long)bbd_data + 0x40)
                      );
    if (iVar9 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar9 = 0x209;
      goto LAB_00111841;
    }
  }
  else {
    *jcurPtr = 0;
    iVar9 = SUNMatCopy(*(undefined8 *)((long)bbd_data + 0x38),*(undefined8 *)((long)bbd_data + 0x40)
                      );
    if (iVar9 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar9 = 0x1e9;
      goto LAB_00111841;
    }
  }
  if (iVar9 != 0) {
    return 1;
  }
  iVar9 = SUNMatScaleAddI(-gamma,*(undefined8 *)((long)bbd_data + 0x40));
  if (iVar9 == 0) {
    iVar9 = SUNLinSolSetup_Band(*(SUNLinearSolver *)((long)bbd_data + 0x48),
                                *(SUNMatrix *)((long)bbd_data + 0x40));
    return iVar9;
  }
  msgfmt = "An error arose from a SUNBandMatrix routine.";
  iVar9 = 0x214;
LAB_00111841:
  cvProcessError(cv_mem,-1,iVar9,"CVBBDPrecSetup",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bbdpre.c"
                 ,msgfmt);
  return -1;
}

Assistant:

static int CVBBDPrecSetup(sunrealtype t, N_Vector y,
                          SUNDIALS_MAYBE_UNUSED N_Vector fy, sunbooleantype jok,
                          sunbooleantype* jcurPtr, sunrealtype gamma,
                          void* bbd_data)
{
  CVBBDPrecData pdata;
  CVodeMem cv_mem;
  int retval;

  pdata  = (CVBBDPrecData)bbd_data;
  cv_mem = (CVodeMem)pdata->cvode_mem;

  /* If jok = SUNTRUE, use saved copy of J */
  if (jok)
  {
    *jcurPtr = SUNFALSE;
    retval   = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__,
                     MSGBBD_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }

    /* Otherwise call CVBBDDQJac for new J value */
  }
  else
  {
    *jcurPtr = SUNTRUE;
    retval   = SUNMatZero(pdata->savedJ);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__,
                     MSGBBD_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = CVBBDDQJac(pdata, t, y, pdata->tmp1, pdata->tmp2, pdata->tmp3);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__,
                     MSGBBD_FUNC_FAILED);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__,
                     MSGBBD_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }
  }

  /* Scale and add I to get P = I - gamma*J */
  retval = SUNMatScaleAddI(-gamma, pdata->savedP);
  if (retval)
  {
    cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBBD_SUNMAT_FAIL);
    return (-1);
  }

  /* Do LU factorization of matrix and return error flag */
  retval = SUNLinSolSetup_Band(pdata->LS, pdata->savedP);
  return (retval);
}